

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O2

void __thiscall
TempTracker<ObjectTempVerify>::MergeData
          (TempTracker<ObjectTempVerify> *this,TempTracker<ObjectTempVerify> *fromData,
          bool deleteData)

{
  undefined3 in_register_00000011;
  
  TempTrackerBase::MergeData((TempTrackerBase *)this,(TempTrackerBase *)fromData,deleteData);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (&(this->super_ObjectTempVerify).removedUpwardExposedUse,
             &(fromData->super_ObjectTempVerify).removedUpwardExposedUse);
  if (CONCAT31(in_register_00000011,deleteData) != 0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,TempTracker<ObjectTempVerify>>
              ((this->super_ObjectTempVerify).super_TempTrackerBase.nonTempSyms.alloc,fromData);
    return;
  }
  return;
}

Assistant:

void
TempTracker<T>::MergeData(TempTracker<T> * fromData, bool deleteData)
{
    TempTrackerBase::MergeData(fromData, deleteData);
    T::MergeData(fromData, deleteData);

    if (deleteData)
    {
        JitAdelete(this->GetAllocator(), fromData);
    }
}